

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__refill_buffer(stbi__context *s)

{
  int iVar1;
  long in_RDI;
  int n;
  
  iVar1 = (**(code **)(in_RDI + 0x10))
                    (*(undefined8 *)(in_RDI + 0x28),in_RDI + 0x38,*(undefined4 *)(in_RDI + 0x34));
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x30) = 0;
    *(long *)(in_RDI + 0xb8) = in_RDI + 0x38;
    *(long *)(in_RDI + 0xc0) = in_RDI + 0x39;
    **(undefined1 **)(in_RDI + 0xb8) = 0;
  }
  else {
    *(long *)(in_RDI + 0xb8) = in_RDI + 0x38;
    *(long *)(in_RDI + 0xc0) = in_RDI + 0x38 + (long)iVar1;
  }
  return;
}

Assistant:

static void stbi__refill_buffer(stbi__context *s)
{
   int n = (s->io.read)(s->io_user_data,(char*)s->buffer_start,s->buflen);
   if (n == 0) {
      // at end of file, treat same as if from memory, but need to handle case
      // where s->img_buffer isn't pointing to safe memory, e.g. 0-byte file
      s->read_from_callbacks = 0;
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start+1;
      *s->img_buffer = 0;
   } else {
      s->img_buffer = s->buffer_start;
      s->img_buffer_end = s->buffer_start + n;
   }
}